

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer2.c
# Opt level: O3

char * strnstr(char *haystack,char *needle,size_t len)

{
  char cVar1;
  int iVar2;
  void *pvVar3;
  size_t __n;
  ulong uVar4;
  
  pvVar3 = memchr(needle,0,len);
  if ((long)pvVar3 - (long)needle != 0) {
    __n = (long)pvVar3 - (long)needle;
    if (pvVar3 == (void *)0x0) {
      __n = len;
    }
    cVar1 = *needle;
    uVar4 = 0;
    do {
      if (haystack[uVar4] == cVar1) {
        iVar2 = strncmp(haystack + uVar4,needle,__n);
        if (iVar2 == 0) {
          return haystack + uVar4;
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 <= len - __n);
    haystack = (char *)0x0;
  }
  return haystack;
}

Assistant:

static char*
strnstr(const char *haystack, const char *needle, size_t len)
{
    size_t i;
    size_t needleLen;
    const char* needleEnd;

    // strnlen is not part of the C standard and does not compile on some platforms, 
    // use case is covered by memchr.
    needleEnd = (char *)memchr(needle, 0, len);
    if (needleEnd == needle)
        return (char *)haystack;

    needleLen = len;
    if (needleEnd != NULL)
        needleLen = needleEnd - needle;

    for (i = 0; i <= len - needleLen; i++)
    {
        if (haystack[0] == needle[0]
            && strncmp(haystack, needle, needleLen) == 0)
            return (char *)haystack;
        haystack++;
    }
    return NULL;
}